

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall MemoryAccountant::clear(MemoryAccountant *this)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *node;
  
  node = this->head_;
  while (node != (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = node->next_;
    destroyAccountantAllocationNode(this,node);
    node = pMVar1;
  }
  this->head_ = (MemoryAccountantAllocationNode *)0x0;
  return;
}

Assistant:

void MemoryAccountant::clear()
{
    MemoryAccountantAllocationNode* node = head_;
    MemoryAccountantAllocationNode* to_be_deleted = NULLPTR;
    while (node) {
        to_be_deleted = node;
        node = node->next_;
        destroyAccountantAllocationNode(to_be_deleted);
    }
    head_ = NULLPTR;
}